

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::getDualUnboundednessDirection
          (Highs *this,bool *has_dual_unboundedness_direction,
          double *dual_unboundedness_direction_value)

{
  HighsStatus HVar1;
  long lVar2;
  long lVar3;
  HighsStatus HVar4;
  vector<double,_std::allocator<double>_> dual_unboundedness_direction;
  vector<double,_std::allocator<double>_> dual_ray_value;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  
  if (dual_unboundedness_direction_value == (double *)0x0) {
    *has_dual_unboundedness_direction = false;
    HVar1 = getDualRayInterface(this,has_dual_unboundedness_direction,(double *)0x0);
    return HVar1;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_40,(long)(this->model_).lp_.num_row_,(allocator_type *)&local_58);
  *has_dual_unboundedness_direction = false;
  HVar1 = getDualRayInterface(this,has_dual_unboundedness_direction,
                              local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
  HVar4 = kError;
  if ((HVar1 != kOk) || (*has_dual_unboundedness_direction == false)) goto LAB_0020bfe3;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HighsSparseMatrix::productTransposeQuad(&(this->model_).lp_.a_matrix_,&local_58,&local_40,-2);
  lVar2 = (long)(this->model_).lp_.num_col_;
  if (lVar2 < 1) {
    if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) goto LAB_0020bfdc;
  }
  else {
    lVar3 = 0;
    do {
      dual_unboundedness_direction_value[lVar3] =
           local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
LAB_0020bfdc:
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HVar4 = kOk;
LAB_0020bfe3:
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar4;
}

Assistant:

HighsStatus Highs::getDualUnboundednessDirection(
    bool& has_dual_unboundedness_direction,
    double* dual_unboundedness_direction_value) {
  if (dual_unboundedness_direction_value) {
    std::vector<double> dual_ray_value(this->model_.lp_.num_row_);
    HighsStatus status =
        getDualRay(has_dual_unboundedness_direction, dual_ray_value.data());
    if (status != HighsStatus::kOk || !has_dual_unboundedness_direction)
      return HighsStatus::kError;
    std::vector<double> dual_unboundedness_direction;
    this->model_.lp_.a_matrix_.productTransposeQuad(
        dual_unboundedness_direction, dual_ray_value);
    for (HighsInt iCol = 0; iCol < this->model_.lp_.num_col_; iCol++)
      dual_unboundedness_direction_value[iCol] =
          dual_unboundedness_direction[iCol];
  } else {
    return getDualRay(has_dual_unboundedness_direction, nullptr);
  }
  return HighsStatus::kOk;
}